

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O0

bool __thiscall
Merge::collectCorrectable
          (Merge *this,vector<Varnode_*,_std::allocator<Varnode_*>_> *vlist,
          list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *oplist,
          vector<int,_std::allocator<int>_> *slotlist,PcodeOp *op)

{
  bool bVar1;
  int4 i;
  uintm uVar2;
  BlockBasic *this_00;
  reference ppVVar3;
  Cover *this_01;
  CoverBlock *this_02;
  reference ppPVar4;
  _Self local_90;
  _List_node_base *local_88;
  __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_> local_80;
  Varnode **local_78;
  uintm local_6c;
  int4 local_68;
  uintm opuindex;
  int4 bound;
  int4 slot;
  PcodeOp *edgeop;
  Varnode *vn;
  const_iterator oiter;
  const_iterator viter;
  int4 blk;
  PcodeOp *op_local;
  vector<int,_std::allocator<int>_> *slotlist_local;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *oplist_local;
  vector<Varnode_*,_std::allocator<Varnode_*>_> *vlist_local;
  Merge *this_local;
  
  this_00 = PcodeOp::getParent(op);
  i = FlowBlock::getIndex(&this_00->super_FlowBlock);
  __gnu_cxx::
  __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>::
  __normal_iterator((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                     *)&oiter);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator((_List_const_iterator<PcodeOp_*> *)&vn)
  ;
  local_6c = CoverBlock::getUIndex(op);
  local_78 = (Varnode **)std::vector<Varnode_*,_std::allocator<Varnode_*>_>::begin(vlist);
  oiter._M_node = (_List_node_base *)local_78;
  while( true ) {
    local_80._M_current = (Varnode **)std::vector<Varnode_*,_std::allocator<Varnode_*>_>::end(vlist)
    ;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                        *)&oiter,&local_80);
    if (!bVar1) {
      return true;
    }
    ppVVar3 = __gnu_cxx::
              __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
              ::operator*((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                           *)&oiter);
    edgeop = (PcodeOp *)*ppVVar3;
    this_01 = Varnode::getCover((Varnode *)edgeop);
    this_02 = Cover::getCoverBlock(this_01,i);
    local_68 = CoverBlock::boundary(this_02,op);
    if (local_68 == 0) break;
    if (local_68 != 2) {
      local_88 = (_List_node_base *)Varnode::beginDescend((Varnode *)edgeop);
      vn = (Varnode *)local_88;
      while( true ) {
        local_90._M_node = (_List_node_base *)Varnode::endDescend((Varnode *)edgeop);
        bVar1 = std::operator!=((_Self *)&vn,&local_90);
        if (!bVar1) break;
        ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*
                            ((_List_const_iterator<PcodeOp_*> *)&vn);
        _bound = *ppPVar4;
        uVar2 = CoverBlock::getUIndex(_bound);
        if (uVar2 == local_6c) {
          std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                    (oplist,(value_type *)&bound);
          opuindex = PcodeOp::getSlot(_bound,(Varnode *)edgeop);
          std::vector<int,_std::allocator<int>_>::push_back
                    (slotlist,(value_type_conflict1 *)&opuindex);
        }
        std::_List_const_iterator<PcodeOp_*>::operator++((_List_const_iterator<PcodeOp_*> *)&vn);
      }
    }
    __gnu_cxx::
    __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>::
    operator++((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                *)&oiter);
  }
  return false;
}

Assistant:

bool Merge::collectCorrectable(const vector<Varnode *> &vlist,list<PcodeOp *> &oplist,
			       vector<int4> &slotlist,PcodeOp *op)
{
  int4 blk = op->getParent()->getIndex();
  vector<Varnode *>::const_iterator viter;
  list<PcodeOp *>::const_iterator oiter;
  Varnode *vn;
  PcodeOp *edgeop;
  int4 slot,bound;
  uintm opuindex = CoverBlock::getUIndex(op);

  for(viter=vlist.begin();viter!=vlist.end();++viter) {
    vn = *viter;
    bound = vn->getCover()->getCoverBlock(blk).boundary(op);
    if (bound == 0) return false;
    if (bound == 2) continue;	// Not defined before op (intersects with write op)
    for(oiter=vn->beginDescend();oiter!=vn->endDescend();++oiter) {
      edgeop = *oiter;
      if (CoverBlock::getUIndex(edgeop) == opuindex) { // Correctable
	oplist.push_back(edgeop);
	slot = edgeop->getSlot(vn);
	slotlist.push_back(slot);
      }
    }
  }
  return true;
}